

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution::forward(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  Layer *pLVar2;
  int *piVar3;
  float *pfVar4;
  undefined4 *in_RCX;
  long in_RDX;
  Mat *in_RSI;
  long in_RDI;
  float w_2;
  float val_1;
  int k_1;
  float *sptr_1;
  Mat m_1;
  int q_1;
  float *kptr_1;
  float sum_1;
  int j_2;
  int i_2;
  float *outptr_1;
  int p_1;
  Option opt_g_1;
  int w_1;
  int val;
  int k;
  char *sptr;
  Mat m;
  int q;
  char *kptr;
  int sum;
  int j_1;
  int i_1;
  int *outptr;
  int p;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outh;
  int outw;
  int hpad;
  int wpad;
  Mat bottom_blob_bordered;
  Option opt_g;
  Mat bottom_blob_int8;
  Mat bottom_blob_unbordered;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat weights [4];
  ParamDict pd;
  Layer *op;
  int num_input;
  undefined4 in_stack_fffffffffffff588;
  int in_stack_fffffffffffff58c;
  Mat *in_stack_fffffffffffff590;
  undefined4 in_stack_fffffffffffff598;
  undefined4 in_stack_fffffffffffff59c;
  undefined4 in_stack_fffffffffffff5a0;
  int in_stack_fffffffffffff5a4;
  size_type in_stack_fffffffffffff5a8;
  Mat *in_stack_fffffffffffff5b0;
  ParamDict *in_stack_fffffffffffff5e0;
  Mat *local_9d8;
  Mat *local_998;
  int local_974;
  Mat local_968;
  int local_92c;
  float *local_928;
  float local_91c;
  int local_918;
  int local_914;
  Mat local_910;
  float *local_8d8;
  int local_8cc;
  undefined4 local_8c8;
  undefined4 uStack_8c4;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  int local_8a4;
  int local_8a0;
  int local_89c;
  char *local_898;
  Mat local_890;
  int local_854;
  char *local_850;
  int local_844;
  int local_840;
  int local_83c;
  Mat local_838;
  int *local_800;
  int local_7f8;
  int local_7f4;
  int local_7f0;
  int local_7ec;
  int local_7e8;
  int local_7e4;
  reference local_7e0;
  vector<int,_std::allocator<int>_> local_7d0;
  int local_7b4;
  int local_7b0;
  int local_7ac;
  int local_7a8;
  int local_7a4;
  Mat local_7a0;
  undefined4 local_768;
  undefined4 uStack_764;
  Allocator *pAStack_760;
  undefined8 local_758;
  uint local_74c;
  Mat local_748;
  Mat local_710;
  int local_6d8;
  int local_6d4;
  size_t local_6d0;
  int local_6c4;
  int local_6c0;
  int local_6bc;
  undefined1 local_6b8 [16];
  Mat local_6a8;
  Mat local_670;
  Mat local_638 [4];
  Mat MStack_558;
  float in_stack_fffffffffffffae4;
  int in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffaec;
  int in_stack_fffffffffffffaf0;
  int in_stack_fffffffffffffaf4;
  Mat *in_stack_fffffffffffffaf8;
  Mat *in_stack_fffffffffffffb00;
  int in_stack_fffffffffffffb10;
  Allocator *in_stack_fffffffffffffb18;
  int in_stack_fffffffffffffb20;
  int local_4;
  
  if ((((in_RSI->dims == 1) && (*(int *)(in_RDI + 0x84) == 1)) && (*(int *)(in_RDI + 0x88) == 1)) &&
     (in_RSI->w == *(int *)(in_RDI + 0xa8) / *(int *)(in_RDI + 0x80))) {
    pLVar2 = create_layer(in_stack_fffffffffffff58c);
    ParamDict::ParamDict(in_stack_fffffffffffff5e0);
    ParamDict::set((ParamDict *)&MStack_558.elemsize,0,*(int *)(in_RDI + 0x80));
    ParamDict::set((ParamDict *)&MStack_558.elemsize,1,*(int *)(in_RDI + 0xa4));
    ParamDict::set((ParamDict *)&MStack_558.elemsize,2,*(int *)(in_RDI + 0xa8));
    ParamDict::set((ParamDict *)&MStack_558.elemsize,8,*(int *)(in_RDI + 0xac));
    MStack_558.allocator._0_4_ = *(byte *)(in_RDI + 0x128) & 1;
    (*pLVar2->_vptr_Layer[2])(pLVar2,&MStack_558.elemsize);
    local_998 = local_638;
    do {
      Mat::Mat(local_998);
      local_998 = local_998 + 1;
    } while (local_998 != &MStack_558);
    Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
                   in_stack_fffffffffffff590);
    Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
                   in_stack_fffffffffffff590);
    if (*(int *)(in_RDI + 0xac) != 0) {
      Mat::Mat(&local_670,1,4,(void *)(in_RDI + 0x120),4,(Allocator *)0x0);
      Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
                     in_stack_fffffffffffff590);
      Mat::~Mat((Mat *)0x1609e1);
      Mat::Mat(&local_6a8,1,4,(void *)(in_RDI + 0x124),4,(Allocator *)0x0);
      Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
                     in_stack_fffffffffffff590);
      Mat::~Mat((Mat *)0x160a38);
    }
    ModelBinFromMatArray::ModelBinFromMatArray
              ((ModelBinFromMatArray *)in_stack_fffffffffffff590,
               (Mat *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588));
    (*pLVar2->_vptr_Layer[3])(pLVar2,local_6b8);
    (*pLVar2->_vptr_Layer[5])(pLVar2,in_RSI,in_RDX,in_RCX);
    if (pLVar2 != (Layer *)0x0) {
      (*pLVar2->_vptr_Layer[1])();
    }
    local_9d8 = &MStack_558;
    do {
      local_9d8 = local_9d8 + -1;
      Mat::~Mat((Mat *)0x160bf8);
    } while (local_9d8 != local_638);
    ParamDict::~ParamDict
              ((ParamDict *)CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0));
    return 0;
  }
  local_6bc = in_RSI->w;
  local_6c0 = in_RSI->h;
  local_6c4 = in_RSI->c;
  local_6d0 = in_RSI->elemsize;
  local_6d4 = *(int *)(in_RDI + 0x8c) * (*(int *)(in_RDI + 0x84) + -1) + 1;
  local_6d8 = *(int *)(in_RDI + 0x90) * (*(int *)(in_RDI + 0x88) + -1) + 1;
  Mat::Mat(&local_710,in_RSI);
  if (((*(byte *)(in_RDI + 0x128) & 1) != 0) && (local_6d0 != 1)) {
    Mat::Mat(&local_748);
    Mat::create(in_stack_fffffffffffff5b0,(int)(in_stack_fffffffffffff5a8 >> 0x20),
                (int)in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a4,
                CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
                (Allocator *)in_stack_fffffffffffff590);
    bVar1 = Mat::empty(in_stack_fffffffffffff590);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      local_758 = *(undefined8 *)(in_RCX + 4);
      local_768 = *in_RCX;
      uStack_764 = in_RCX[1];
      pAStack_760 = local_748.allocator;
      (**(code **)(**(long **)(in_RDI + 0x130) + 0x28))
                (*(long **)(in_RDI + 0x130),in_RSI,&local_748,&local_768);
      Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
                     in_stack_fffffffffffff590);
    }
    local_74c = (uint)bVar1;
    Mat::~Mat((Mat *)0x160e9a);
    if (local_74c != 0) goto LAB_00161b71;
  }
  Mat::Mat(&local_7a0,&local_710);
  if ((*(int *)(in_RDI + 0x9c) < 1) && (*(int *)(in_RDI + 0xa0) < 1)) {
    if ((*(int *)(in_RDI + 0x9c) == -0xe9) && (*(int *)(in_RDI + 0xa0) == -0xe9)) {
      local_7a4 = (local_6d4 +
                  ((local_6bc + -1) / *(int *)(in_RDI + 0x94)) * *(int *)(in_RDI + 0x94)) -
                  local_6bc;
      local_7a8 = (local_6d8 +
                  ((local_6c0 + -1) / *(int *)(in_RDI + 0x98)) * *(int *)(in_RDI + 0x98)) -
                  local_6c0;
      if ((0 < local_7a4) || (0 < local_7a8)) {
        in_stack_fffffffffffff590 = *(Mat **)(in_RCX + 4);
        in_stack_fffffffffffff598 = in_RCX[1];
        copy_make_border(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                         in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0,
                         in_stack_fffffffffffffaec,in_stack_fffffffffffffae8,
                         in_stack_fffffffffffffb10,in_stack_fffffffffffffae4,
                         in_stack_fffffffffffffb18,in_stack_fffffffffffffb20);
        bVar1 = Mat::empty(in_stack_fffffffffffff590);
        if (bVar1) {
          local_4 = -100;
          local_74c = 1;
          goto LAB_00161b53;
        }
      }
      local_6bc = local_7a0.w;
      local_6c0 = local_7a0.h;
    }
LAB_00161138:
    local_7ac = (local_6bc - local_6d4) / *(int *)(in_RDI + 0x94) + 1;
    local_7b0 = (local_6c0 - local_6d8) / *(int *)(in_RDI + 0x98) + 1;
    Mat::create(in_stack_fffffffffffff5b0,(int)(in_stack_fffffffffffff5a8 >> 0x20),
                (int)in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a4,
                CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
                (Allocator *)in_stack_fffffffffffff590);
    bVar1 = Mat::empty(in_stack_fffffffffffff590);
    if (bVar1) {
      local_4 = -100;
      local_74c = 1;
    }
    else {
      local_7b4 = *(int *)(in_RDI + 0x84) * *(int *)(in_RDI + 0x88);
      std::allocator<int>::allocator((allocator<int> *)0x16123a);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff5b0,
                 in_stack_fffffffffffff5a8,
                 (allocator_type *)CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0));
      std::allocator<int>::~allocator((allocator<int> *)0x161260);
      local_7e0 = std::vector<int,_std::allocator<int>_>::operator[](&local_7d0,0);
      local_7e4 = 0;
      local_7e8 = 0;
      local_7ec = local_6bc * *(int *)(in_RDI + 0x90) -
                  *(int *)(in_RDI + 0x84) * *(int *)(in_RDI + 0x8c);
      for (local_7f0 = 0; local_7f0 < *(int *)(in_RDI + 0x88); local_7f0 = local_7f0 + 1) {
        for (local_7f4 = 0; local_7f4 < *(int *)(in_RDI + 0x84); local_7f4 = local_7f4 + 1) {
          local_7e0[local_7e4] = local_7e8;
          local_7e4 = local_7e4 + 1;
          local_7e8 = *(int *)(in_RDI + 0x8c) + local_7e8;
        }
        local_7e8 = local_7ec + local_7e8;
      }
      if ((*(byte *)(in_RDI + 0x128) & 1) == 0) {
        for (local_8cc = 0; local_8cc < *(int *)(in_RDI + 0x80); local_8cc = local_8cc + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
                       (int)((ulong)in_stack_fffffffffffff590 >> 0x20));
          pfVar4 = Mat::operator_cast_to_float_(&local_910);
          Mat::~Mat((Mat *)0x1617ee);
          local_8d8 = pfVar4;
          for (local_914 = 0; local_914 < local_7b0; local_914 = local_914 + 1) {
            for (local_918 = 0; local_918 < local_7ac; local_918 = local_918 + 1) {
              local_91c = 0.0;
              if (*(int *)(in_RDI + 0xa4) != 0) {
                pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0xe8),local_8cc);
                local_91c = *pfVar4;
              }
              local_928 = Mat::operator_cast_to_float_((Mat *)(in_RDI + 0xb0));
              local_928 = local_928 + local_7b4 * local_6c4 * local_8cc;
              for (local_92c = 0; local_92c < local_6c4; local_92c = local_92c + 1) {
                Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
                             (int)((ulong)in_stack_fffffffffffff590 >> 0x20));
                pfVar4 = Mat::row(&local_968,local_914 * *(int *)(in_RDI + 0x98));
                for (local_974 = 0; local_974 < local_7b4; local_974 = local_974 + 1) {
                  local_91c = pfVar4[(long)(local_918 * *(int *)(in_RDI + 0x94)) +
                                     (long)local_7e0[local_974]] * local_928[local_974] + local_91c;
                }
                local_928 = local_928 + local_7b4;
                Mat::~Mat((Mat *)0x161a86);
              }
              local_8d8[local_918] = local_91c;
            }
            local_8d8 = local_8d8 + local_7ac;
          }
        }
      }
      else {
        for (local_7f8 = 0; local_7f8 < *(int *)(in_RDI + 0x80); local_7f8 = local_7f8 + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
                       (int)((ulong)in_stack_fffffffffffff590 >> 0x20));
          piVar3 = Mat::operator_cast_to_int_(&local_838);
          Mat::~Mat((Mat *)0x16142c);
          local_800 = piVar3;
          for (local_83c = 0; local_83c < local_7b0; local_83c = local_83c + 1) {
            for (local_840 = 0; local_840 < local_7ac; local_840 = local_840 + 1) {
              local_844 = 0;
              local_850 = Mat::operator_cast_to_signed_char_((Mat *)(in_RDI + 0xb0));
              local_850 = local_850 + local_7b4 * local_6c4 * local_7f8;
              for (local_854 = 0; local_854 < local_6c4; local_854 = local_854 + 1) {
                Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
                             (int)((ulong)in_stack_fffffffffffff590 >> 0x20));
                local_898 = Mat::row<signed_char>(&local_890,local_83c * *(int *)(in_RDI + 0x98));
                local_898 = local_898 + local_840 * *(int *)(in_RDI + 0x94);
                for (local_89c = 0; local_89c < local_7b4; local_89c = local_89c + 1) {
                  local_8a0 = (int)local_898[local_7e0[local_89c]];
                  local_8a4 = (int)local_850[local_89c];
                  local_844 = local_8a0 * local_8a4 + local_844;
                }
                local_850 = local_850 + local_7b4;
                Mat::~Mat((Mat *)0x16167c);
              }
              local_800[local_840] = local_844;
            }
            local_800 = local_800 + local_7ac;
          }
        }
        local_8b8 = *(undefined8 *)(in_RCX + 4);
        local_8c8 = *in_RCX;
        uStack_8c4 = in_RCX[1];
        uStack_8c0 = *(undefined8 *)(in_RDX + 0x18);
        (**(code **)(**(long **)(in_RDI + 0x138) + 0x38))
                  (*(long **)(in_RDI + 0x138),in_RDX,&local_8c8);
      }
      local_4 = 0;
      local_74c = 1;
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0));
    }
  }
  else {
    in_stack_fffffffffffff590 = *(Mat **)(in_RCX + 4);
    in_stack_fffffffffffff598 = in_RCX[1];
    copy_make_border(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf4,
                     in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec,in_stack_fffffffffffffae8,
                     in_stack_fffffffffffffb10,in_stack_fffffffffffffae4,in_stack_fffffffffffffb18,
                     in_stack_fffffffffffffb20);
    bVar1 = Mat::empty(in_stack_fffffffffffff590);
    if (!bVar1) {
      local_6bc = local_7a0.w;
      local_6c0 = local_7a0.h;
      goto LAB_00161138;
    }
    local_4 = -100;
    local_74c = 1;
  }
LAB_00161b53:
  Mat::~Mat((Mat *)0x161b60);
LAB_00161b71:
  Mat::~Mat((Mat *)0x161b7e);
  return local_4;
}

Assistant:

int Convolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        int num_input = weight_data_size / num_output;
        if (bottom_blob.w == num_input)
        {
            // call InnerProduct
            ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::InnerProduct);

            // set param
            ncnn::ParamDict pd;
            pd.set(0, num_output);
            pd.set(1, bias_term);
            pd.set(2, weight_data_size);
            pd.set(8, int8_scale_term);

            pd.use_int8_inference = use_int8_inference;

            op->load_param(pd);

            // set weights
            ncnn::Mat weights[4];
            weights[0] = weight_data;
            weights[1] = bias_data;

            if (int8_scale_term)
            {
                weights[2] = Mat(1, (size_t)4u, (void*)&weight_data_int8_scale);
                weights[3] = Mat(1, (size_t)4u, (void*)&bottom_blob_int8_scale);
            }

            op->load_model(ModelBinFromMatArray(weights));

            // forward
            op->forward(bottom_blob, top_blob, opt);

            delete op;

            return 0;
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Convolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        // quantize, scale and round to nearest
        {
            ncnn::Option opt_g = opt;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            quantize->forward(bottom_blob, bottom_blob_int8, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;
    }

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    if (use_int8_inference)
    {
        // num_output
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<num_output; p++)
        {
            int* outptr = top_blob.channel(p);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    int sum = 0;

                    const signed char* kptr = (const signed char*)weight_data + maxk * channels * p;

                    // channels
                    for (int q=0; q<channels; q++)
                    {
                        const Mat m = bottom_blob_bordered.channel(q);
                        const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                        for (int k = 0; k < maxk; k++)
                        {
                            int val = sptr[ space_ofs[k] ];
                            int w = kptr[k];
                            sum += val * w;
                        }

                        kptr += maxk;
                    }

                    outptr[j] = sum;
                }

                outptr += outw;
            }
        }

        // dequantize, reverse scale inplace
        {
            ncnn::Option opt_g = opt;
            opt_g.blob_allocator = top_blob.allocator;

            dequantize->forward_inplace(top_blob, opt_g);
        }

        return 0;
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++) // 29.23
                    {
                        float val = sptr[ space_ofs[k] ]; // 20.72
                        float w = kptr[k];
                        sum += val * w; // 41.45
                    }

                    kptr += maxk;
                }

                outptr[j] = sum;
            }

            outptr += outw;
        }
    }

    return 0;
}